

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_ack_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  anon_struct_4_2_d91fd178_for_address_validation *paVar1;
  uint64_t *puVar2;
  ushort uVar3;
  uint32_t uVar4;
  ulong uVar5;
  _func_void_void_ptr_char_ptr_varargs *p_Var6;
  st_quicly_application_space_t *psVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  quicly_sent_packet_t *pqVar14;
  ulong uVar15;
  int64_t iVar16;
  uint uVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint uVar20;
  undefined8 uVar21;
  long lVar22;
  int64_t local_1090;
  quicly_sentmap_iter_t iter;
  quicly_ack_frame_t frame;
  
  iVar11 = quicly_decode_ack_frame(&state->src,state->end,&frame,(uint)(state->frame_type == 3));
  if (iVar11 == 0) {
    iVar11 = 0x2000a;
    if (state->epoch != 1) {
      if (state->epoch == 2) {
        paVar1 = &(conn->super).remote.address_validation;
        *(byte *)paVar1 = *(byte *)paVar1 & 0xfd;
      }
      init_acks_iter(conn,&iter);
      local_1090 = 0x7fffffffffffffff;
      uVar18 = 0xffffffffffffffff;
      bVar10 = false;
      lVar22 = 0;
      uVar19 = frame.num_gaps;
      uVar15 = frame.smallest_acknowledged;
      do {
        if (frame.ack_block_lengths[uVar19] == 0) {
          __assert_fail("frame.ack_block_lengths[gap_index] != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x129d,
                        "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                       );
        }
        uVar13 = frame.ack_block_lengths[uVar19] + uVar15;
        while (pqVar14 = quicly_sentmap_get(&iter), pqVar14->packet_number < uVar15) {
          quicly_sentmap_skip(&iter);
        }
        do {
          pqVar14 = quicly_sentmap_get(&iter);
          uVar5 = pqVar14->packet_number;
          if (uVar5 < uVar15) {
            __assert_fail("pn_acked <= pn_sent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0x12a7,
                          "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                         );
          }
          if ((uVar15 < uVar5) && (uVar15 = uVar5, uVar13 - 1 < uVar5)) goto LAB_0011eb5f;
          uVar18 = uVar15;
          if (state->epoch != (ulong)pqVar14->ack_epoch) {
            return 0x2000a;
          }
          if ((pqVar14->field_0x11 & 1) == 0) {
            uVar21 = 0;
          }
          else if (pqVar14->cc_bytes_in_flight == 0) {
            puVar2 = &(conn->super).stats.num_packets.late_acked;
            *puVar2 = *puVar2 + 1;
            bVar10 = true;
            uVar21 = 1;
          }
          else {
            bVar10 = true;
            uVar21 = 0;
          }
          puVar2 = &(conn->super).stats.num_packets.ack_received;
          *puVar2 = *puVar2 + 1;
          local_1090 = pqVar14->sent_at;
          p_Var6 = (conn->super).tracer.cb;
          if (p_Var6 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
            (*p_Var6)((conn->super).tracer.ctx,
                      "{\"type\":\"packet-acked\", \"time\":%lld, \"pn\":%llu, \"is-late-ack\":%lld}\n"
                      ,(conn->stash).now,uVar18,uVar21);
          }
          uVar3 = pqVar14->cc_bytes_in_flight;
          iVar11 = quicly_sentmap_update
                             (&(conn->egress).loss.sentmap,&iter,QUICLY_SENTMAP_EVENT_ACKED);
          if (iVar11 != 0) {
            return iVar11;
          }
          if ((state->epoch == 3) &&
             (psVar7 = conn->application, (psVar7->cipher).egress.key_update_pn.last <= uVar18)) {
            (psVar7->cipher).egress.key_update_pn.last = 0xffffffffffffffff;
            (psVar7->cipher).egress.key_update_pn.next =
                 ((conn->super).ctx)->max_packets_per_key + (conn->egress).packet_number;
          }
          lVar22 = lVar22 + (ulong)uVar3;
          uVar15 = uVar18 + 1;
        } while (uVar15 <= uVar13 - 1);
        if (uVar15 != uVar13) {
          __assert_fail("pn_acked == pn_block_max + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x12cf,
                        "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                       );
        }
LAB_0011eb5f:
        if (uVar19 == 0) {
          iVar11 = on_ack_stream_ack_cached(conn);
          if (iVar11 != 0) {
            return iVar11;
          }
          if (uVar18 != 0xffffffffffffffff) {
            sVar8 = state->epoch;
            if ('\0' < (conn->egress).loss.pto_count) {
              (conn->egress).loss.pto_count = '\0';
            }
            if ((conn->egress).loss.largest_acked_packet_plus1[sVar8] <= uVar18) {
              iVar16 = (conn->stash).now;
              (conn->egress).loss.largest_acked_packet_plus1[sVar8] = uVar18 + 1;
              if (bVar10) {
                auVar9._8_8_ = 0;
                auVar9._0_8_ = (frame.ack_delay << (*(conn->egress).loss.ack_delay_exponent & 0x3f))
                               * 2 + 1000;
                uVar12 = SUB164(auVar9 / ZEXT816(2000),0);
                uVar17 = (uint)*(conn->egress).loss.max_ack_delay;
                if (uVar12 < uVar17) {
                  uVar17 = uVar12;
                }
                local_1090._0_4_ = (int)iVar16 - (int)local_1090;
                if ((int)local_1090 == -1) {
                  __assert_fail("latest_rtt != UINT32_MAX",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                                ,0xc6,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
                }
                uVar20 = (int)local_1090 + (uint)((int)local_1090 == 0);
                uVar4 = (conn->egress).loss.rtt.latest;
                (conn->egress).loss.rtt.latest = uVar20;
                uVar12 = (conn->egress).loss.rtt.minimum;
                if (uVar20 < uVar12) {
                  (conn->egress).loss.rtt.minimum = uVar20;
                  uVar12 = uVar20;
                }
                if (uVar12 + uVar17 < uVar20) {
                  uVar20 = uVar20 - uVar17;
                  (conn->egress).loss.rtt.latest = uVar20;
                }
                if (uVar4 == 0) {
                  (conn->egress).loss.rtt.smoothed = uVar20;
                  (conn->egress).loss.rtt.variance = uVar20 >> 1;
                }
                else {
                  uVar17 = (conn->egress).loss.rtt.smoothed;
                  iVar11 = uVar17 - uVar20;
                  if (uVar17 < uVar20) {
                    iVar11 = -(uVar17 - uVar20);
                  }
                  (conn->egress).loss.rtt.variance =
                       (conn->egress).loss.rtt.variance * 3 + iVar11 >> 2;
                  uVar20 = uVar17 * 7 + uVar20 >> 3;
                  (conn->egress).loss.rtt.smoothed = uVar20;
                }
                if (uVar20 == 0) {
                  __assert_fail("rtt->smoothed != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                                ,0xda,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
                }
              }
            }
          }
          iVar16 = (conn->stash).now;
          if (lVar22 != 0) {
            (*((conn->egress).cc.type)->cc_on_acked)
                      (&(conn->egress).cc,&(conn->egress).loss,(uint32_t)lVar22,
                       frame.largest_acknowledged,
                       (int)(conn->egress).loss.sentmap.bytes_in_flight + (uint32_t)lVar22,iVar16,
                       (uint)(conn->egress).max_udp_payload_size);
            p_Var6 = (conn->super).tracer.cb;
            iVar16 = (conn->stash).now;
            if (p_Var6 == (_func_void_void_ptr_char_ptr_varargs *)0x0) goto LAB_0011edc4;
            (*p_Var6)((conn->super).tracer.ctx,
                      "{\"type\":\"quictrace-cc-ack\", \"time\":%lld, \"min-rtt\":%u, \"smoothed-rtt\":%u, \"latest-rtt\":%u, \"cwnd\":%llu, \"inflight\":%llu}\n"
                      ,iVar16,(ulong)(conn->egress).loss.rtt.minimum,
                      (ulong)(conn->egress).loss.rtt.smoothed,(ulong)(conn->egress).loss.rtt.latest,
                      (ulong)(conn->egress).cc.cwnd,(conn->egress).loss.sentmap.bytes_in_flight);
            iVar16 = (conn->stash).now;
          }
          p_Var6 = (conn->super).tracer.cb;
          if (p_Var6 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
            (*p_Var6)((conn->super).tracer.ctx,
                      "{\"type\":\"cc-ack-received\", \"time\":%lld, \"largest-acked\":%llu, \"bytes-acked\":%llu, \"cwnd\":%llu, \"inflight\":%llu}\n"
                      ,iVar16,frame.largest_acknowledged,lVar22,(ulong)(conn->egress).cc.cwnd,
                      (conn->egress).loss.sentmap.bytes_in_flight);
            iVar16 = (conn->stash).now;
          }
LAB_0011edc4:
          uVar17 = 0;
          if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
            uVar17 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
          }
          iVar11 = quicly_loss_detect_loss
                             (&(conn->egress).loss,iVar16,
                              (uint)(conn->super).remote.transport_params.max_ack_delay,uVar17,
                              on_loss_detected);
          if (iVar11 != 0) {
            return iVar11;
          }
          update_loss_alarm(conn,0);
          return 0;
        }
        uVar15 = uVar13 + frame.gaps[uVar19 - 1];
        uVar19 = uVar19 - 1;
      } while( true );
    }
  }
  return iVar11;
}

Assistant:

static int handle_ack_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_ack_frame_t frame;
    quicly_sentmap_iter_t iter;
    struct {
        uint64_t pn;
        int64_t sent_at;
    } largest_newly_acked = {UINT64_MAX, INT64_MAX};
    size_t bytes_acked = 0;
    int includes_ack_eliciting = 0, ret;

    if ((ret = quicly_decode_ack_frame(&state->src, state->end, &frame, state->frame_type == QUICLY_FRAME_TYPE_ACK_ECN)) != 0)
        return ret;

    uint64_t pn_acked = frame.smallest_acknowledged;

    switch (state->epoch) {
    case QUICLY_EPOCH_0RTT:
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    case QUICLY_EPOCH_HANDSHAKE:
        conn->super.remote.address_validation.send_probe = 0;
        break;
    default:
        break;
    }

    init_acks_iter(conn, &iter);

    /* TODO log PNs being ACKed too late */

    size_t gap_index = frame.num_gaps;
    while (1) {
        assert(frame.ack_block_lengths[gap_index] != 0);
        /* Ack blocks are organized in the ACK frame and consequently in the ack_block_lengths array from the largest acked down.
         * Processing acks in packet number order requires processing the ack blocks in reverse order. */
        uint64_t pn_block_max = pn_acked + frame.ack_block_lengths[gap_index] - 1;
        QUICLY_PROBE(ACK_BLOCK_RECEIVED, conn, conn->stash.now, pn_acked, pn_block_max);
        while (quicly_sentmap_get(&iter)->packet_number < pn_acked)
            quicly_sentmap_skip(&iter);
        do {
            const quicly_sent_packet_t *sent = quicly_sentmap_get(&iter);
            uint64_t pn_sent = sent->packet_number;
            assert(pn_acked <= pn_sent);
            if (pn_acked < pn_sent) {
                /* set pn_acked to pn_sent; or past the end of the ack block, for use with the next ack block */
                if (pn_sent <= pn_block_max) {
                    pn_acked = pn_sent;
                } else {
                    pn_acked = pn_block_max + 1;
                    break;
                }
            }
            /* process newly acked packet */
            if (state->epoch != sent->ack_epoch)
                return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            int is_late_ack = 0;
            if (sent->ack_eliciting) {
                includes_ack_eliciting = 1;
                if (sent->cc_bytes_in_flight == 0) {
                    is_late_ack = 1;
                    ++conn->super.stats.num_packets.late_acked;
                }
            }
            ++conn->super.stats.num_packets.ack_received;
            largest_newly_acked.pn = pn_acked;
            largest_newly_acked.sent_at = sent->sent_at;
            QUICLY_PROBE(PACKET_ACKED, conn, conn->stash.now, pn_acked, is_late_ack);
            if (sent->cc_bytes_in_flight != 0) {
                bytes_acked += sent->cc_bytes_in_flight;
            }
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_ACKED)) != 0)
                return ret;
            if (state->epoch == QUICLY_EPOCH_1RTT) {
                struct st_quicly_application_space_t *space = conn->application;
                if (space->cipher.egress.key_update_pn.last <= pn_acked) {
                    space->cipher.egress.key_update_pn.last = UINT64_MAX;
                    space->cipher.egress.key_update_pn.next = conn->egress.packet_number + conn->super.ctx->max_packets_per_key;
                    QUICLY_PROBE(CRYPTO_SEND_KEY_UPDATE_CONFIRMED, conn, conn->stash.now, space->cipher.egress.key_update_pn.next);
                }
            }
            ++pn_acked;
        } while (pn_acked <= pn_block_max);
        assert(pn_acked == pn_block_max + 1);
        if (gap_index-- == 0)
            break;
        pn_acked += frame.gaps[gap_index];
    }

    if ((ret = on_ack_stream_ack_cached(conn)) != 0)
        return ret;

    QUICLY_PROBE(ACK_DELAY_RECEIVED, conn, conn->stash.now, frame.ack_delay);

    /* Update loss detection engine on ack. The function uses ack_delay only when the largest_newly_acked is also the largest acked
     * so far. So, it does not matter if the ack_delay being passed in does not apply to the largest_newly_acked. */
    quicly_loss_on_ack_received(&conn->egress.loss, largest_newly_acked.pn, state->epoch, conn->stash.now,
                                largest_newly_acked.sent_at, frame.ack_delay, includes_ack_eliciting);

    /* OnPacketAcked and OnPacketAckedCC */
    if (bytes_acked > 0) {
        conn->egress.cc.type->cc_on_acked(&conn->egress.cc, &conn->egress.loss, (uint32_t)bytes_acked, frame.largest_acknowledged,
                                          (uint32_t)(conn->egress.loss.sentmap.bytes_in_flight + bytes_acked), conn->stash.now,
                                          conn->egress.max_udp_payload_size);
        QUICLY_PROBE(QUICTRACE_CC_ACK, conn, conn->stash.now, &conn->egress.loss.rtt, conn->egress.cc.cwnd,
                     conn->egress.loss.sentmap.bytes_in_flight);
    }

    QUICLY_PROBE(CC_ACK_RECEIVED, conn, conn->stash.now, frame.largest_acknowledged, bytes_acked, conn->egress.cc.cwnd,
                 conn->egress.loss.sentmap.bytes_in_flight);

    /* loss-detection  */
    if ((ret = quicly_loss_detect_loss(&conn->egress.loss, conn->stash.now, conn->super.remote.transport_params.max_ack_delay,
                                       conn->initial == NULL && conn->handshake == NULL, on_loss_detected)) != 0)
        return ret;
    update_loss_alarm(conn, 0);

    return 0;
}